

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SphereRecord2.cpp
# Opt level: O3

void __thiscall KDIS::DATA_TYPE::SphereRecord2::Encode(SphereRecord2 *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>
            (stream,(this->super_SphereRecord1).super_BoundingSphereRecord.super_EnvironmentRecord.
                    m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>
            (stream,(this->super_SphereRecord1).super_BoundingSphereRecord.super_EnvironmentRecord.
                    m_ui16Length);
  KDataStream::Write(stream,(this->super_SphereRecord1).super_BoundingSphereRecord.
                            super_EnvironmentRecord.m_ui8Index);
  KDataStream::Write(stream,(this->super_SphereRecord1).super_BoundingSphereRecord.
                            super_EnvironmentRecord.m_ui8Padding);
  (*(this->super_SphereRecord1).super_BoundingSphereRecord.m_CentLocation.super_DataTypeBase.
    _vptr_DataTypeBase[5])
            (&(this->super_SphereRecord1).super_BoundingSphereRecord.m_CentLocation,stream);
  KDataStream::Write<float>
            (stream,(float)(this->super_SphereRecord1).super_BoundingSphereRecord.m_f32Rad);
  KDataStream::Write<float>(stream,(float)this->m_f32ddt);
  (*(this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Velocity,stream);
  (*(this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_AngularVelocity,stream);
  return;
}

Assistant:

void SphereRecord2::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_CentLocation
           << m_f32Rad
           << m_f32ddt
           << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_AngularVelocity;
}